

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O3

void __thiscall
SGParser::Generator::Grammar::AddProductions
          (Grammar *this,
          vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
          *prodList)

{
  pointer pPVar1;
  Production *prod;
  pointer prod_00;
  
  prod_00 = (prodList->
            super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (prodList->
           super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (prod_00 != pPVar1) {
    if (this->ProductionCount == 0) {
      CreateAcceptingProductions(this,prod_00->Left);
      prod_00 = (prodList->
                super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pPVar1 = (prodList->
               super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; prod_00 != pPVar1; prod_00 = prod_00 + 1) {
      AddProductionImpl(this,prod_00);
    }
  }
  return;
}

Assistant:

void Grammar::AddProductions(std::vector<Production>& prodList) {
    if (!prodList.empty()) {
        if (!ProductionCount)
            CreateAcceptingProductions(prodList[0].Left);

        for (auto& prod: prodList)
            AddProductionImpl(prod);
    }
}